

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.h
# Opt level: O2

char * __thiscall
btSliderConstraint::serialize(btSliderConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btTransform::serialize(&this->m_frameInA,(btTransformFloatData *)((long)dataBuffer + 0x40));
  btTransform::serialize(&this->m_frameInB,(btTransformFloatData *)((long)dataBuffer + 0x80));
  bVar1 = this->m_lowerLinLimit;
  bVar2 = this->m_lowerAngLimit;
  bVar3 = this->m_upperAngLimit;
  *(btScalar *)((long)dataBuffer + 0xc0) = this->m_upperLinLimit;
  *(btScalar *)((long)dataBuffer + 0xc4) = bVar1;
  *(btScalar *)((long)dataBuffer + 200) = bVar3;
  *(btScalar *)((long)dataBuffer + 0xcc) = bVar2;
  *(uint *)((long)dataBuffer + 0xd0) = (uint)this->m_useLinearReferenceFrameA;
  *(uint *)((long)dataBuffer + 0xd4) = (uint)this->m_useOffsetForConstraintFrame;
  return "btSliderConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btSliderConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btSliderConstraintData2* sliderData = (btSliderConstraintData2*) dataBuffer;
	btTypedConstraint::serialize(&sliderData->m_typeConstraintData,serializer);

	m_frameInA.serialize(sliderData->m_rbAFrame);
	m_frameInB.serialize(sliderData->m_rbBFrame);

	sliderData->m_linearUpperLimit = m_upperLinLimit;
	sliderData->m_linearLowerLimit = m_lowerLinLimit;

	sliderData->m_angularUpperLimit = m_upperAngLimit;
	sliderData->m_angularLowerLimit = m_lowerAngLimit;

	sliderData->m_useLinearReferenceFrameA = m_useLinearReferenceFrameA;
	sliderData->m_useOffsetForConstraintFrame = m_useOffsetForConstraintFrame;

	return btSliderConstraintDataName;
}